

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_identifier(string *str)

{
  bool bVar1;
  int i;
  long lVar2;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar1 = str_utils::is_alpha(*(str->_M_dataplus)._M_p);
  if (bVar1) {
    for (lVar2 = 1; lVar2 < (int)str->_M_string_length; lVar2 = lVar2 + 1) {
      bVar1 = str_utils::is_alphanumeric((str->_M_dataplus)._M_p[lVar2]);
      if ((!bVar1) && ((str->_M_dataplus)._M_p[lVar2] != '_')) goto LAB_0014eff1;
    }
    bVar1 = is_reserved_word(str);
    bVar1 = !bVar1;
  }
  else {
LAB_0014eff1:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Grammar::is_identifier(const std::string& str) {
    if (str.size() == 0 || !str_utils::is_alpha(str[0]))
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_alphanumeric(str[i]) && str[i] != '_')
            return false;
    return !is_reserved_word(str);
}